

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O3

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingLinkOptionsExpression
          (cmGeneratorExpressionDAGChecker *this)

{
  long *plVar1;
  cmGeneratorExpressionDAGChecker *pcVar2;
  
  do {
    pcVar2 = this;
    this = pcVar2->Parent;
  } while (pcVar2->Parent != (cmGeneratorExpressionDAGChecker *)0x0);
  if ((pcVar2->Property)._M_string_length == 0xc) {
    plVar1 = (long *)(pcVar2->Property)._M_dataplus._M_p;
    return (int)plVar1[1] == 0x534e4f49 && *plVar1 == 0x54504f5f4b4e494c;
  }
  return false;
}

Assistant:

cmGeneratorExpressionDAGChecker const* cmGeneratorExpressionDAGChecker::Top()
  const
{
  const cmGeneratorExpressionDAGChecker* top = this;
  const cmGeneratorExpressionDAGChecker* parent = this->Parent;
  while (parent) {
    top = parent;
    parent = parent->Parent;
  }
  return top;
}